

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O3

Buffer * __thiscall Liby::Connection::sync_read(Buffer *__return_storage_ptr__,Connection *this)

{
  element_type *peVar1;
  char *__buf;
  size_t __nbytes;
  ssize_t sVar2;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  Buffer::Buffer(__return_storage_ptr__,0x1000);
  Socket::setNoblock((this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,false);
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.cpp:105:23)>
             ::_M_invoke;
  local_38._8_8_ = 0;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.cpp:105:23)>
             ::_M_manager;
  peVar1 = (this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38._M_unused._M_object = this;
  __buf = Buffer::data(__return_storage_ptr__);
  __nbytes = Buffer::capacity(__return_storage_ptr__);
  sVar2 = read(peVar1->fd_,__buf,__nbytes);
  if (0 < (int)(uint)sVar2) {
    Buffer::append(__return_storage_ptr__,(ulong)((uint)sVar2 & 0x7fffffff));
  }
  DeferCaller::~DeferCaller((DeferCaller *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

Buffer Connection::sync_read() {
    Buffer ret(4096);
    socket_->setNoblock(false);
    DeferCaller defer([this] { socket_->setNoblock(); });
    int nbytes = socket_->read(static_cast<void *>(ret.data()), ret.capacity());
    if (nbytes > 0) {
        ret.append(nbytes);
    }
    return ret;
}